

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  ImVec2 *mouse_pos;
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiContext *g;
  ImVec2 IVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  
  pIVar3 = GImGui;
  if (((GImGui->NavDisableHighlight == false) && (GImGui->NavDisableMouseHover == true)) &&
     (pIVar2 = GImGui->NavWindow, pIVar2 != (ImGuiWindow *)0x0)) {
    auVar6._0_4_ = (GImGui->Style).FramePadding.x * 4.0;
    IVar5 = pIVar2->NavRectRel[GImGui->NavLayer].Min;
    IVar1 = pIVar2->NavRectRel[GImGui->NavLayer].Max;
    fVar11 = IVar1.y;
    fVar9 = IVar5.x;
    auVar6._4_4_ = (GImGui->Style).FramePadding.y;
    auVar6._8_8_ = 0;
    auVar7._4_4_ = fVar11 - IVar5.y;
    auVar7._0_4_ = IVar1.x - fVar9;
    auVar7._8_8_ = 0;
    auVar7 = minps(auVar6,auVar7);
    auVar8._0_4_ = (pIVar2->Pos).x + fVar9 + auVar7._0_4_;
    auVar8._4_4_ = (pIVar2->Pos).y + (fVar11 - auVar7._4_4_);
    auVar8._8_4_ = auVar7._8_4_ + 0.0 + 0.0;
    auVar8._12_4_ = auVar7._12_4_ + 0.0 + 0.0;
    auVar10._8_8_ = 0;
    auVar10._0_4_ = (GImGui->IO).DisplaySize.x;
    auVar10._4_4_ = (GImGui->IO).DisplaySize.y;
    auVar7 = minps(auVar10,auVar8);
    IVar5.x = (float)(int)(float)(-(uint)(0.0 <= auVar8._0_4_) & auVar7._0_4_);
    IVar5.y = (float)(int)(float)(-(uint)(0.0 <= auVar8._4_4_) & auVar7._4_4_);
  }
  else {
    mouse_pos = &(GImGui->IO).MousePos;
    bVar4 = IsMousePosValid(mouse_pos);
    if (bVar4) {
      IVar5 = *mouse_pos;
    }
    else {
      IVar5 = pIVar3->LastValidMousePos;
    }
  }
  return IVar5;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !g.NavWindow)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        if (IsMousePosValid(&g.IO.MousePos))
            return g.IO.MousePos;
        return g.LastValidMousePos;
    }
    else
    {
        // When navigation is active and mouse is disabled, decide on an arbitrary position around the bottom left of the currently navigated item.
        const ImRect& rect_rel = g.NavWindow->NavRectRel[g.NavLayer];
        ImVec2 pos = g.NavWindow->Pos + ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImRect visible_rect = GetViewportRect();
        return ImFloor(ImClamp(pos, visible_rect.Min, visible_rect.Max));   // ImFloor() is important because non-integer mouse position application in back-end might be lossy and result in undesirable non-zero delta.
    }
}